

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O1

string * PrintTools::SoftPrintVector<unsigned_int>
                   (string *__return_storage_ptr__,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  pointer puVar1;
  string *psVar2;
  pointer puVar3;
  stringstream ss;
  long *local_368;
  long local_360;
  long local_358 [2];
  string *local_348;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_340);
  puVar3 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"< ",2);
  local_348 = __return_storage_ptr__;
  if (puVar3 != puVar1) {
    do {
      if (puVar3 != (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_368,local_360);
      if (local_368 != local_358) {
        operator_delete(local_368,local_358[0] + 1);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_330," >",2);
  psVar2 = local_348;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  return psVar2;
}

Assistant:

static std::string SoftPrintVector(const std::vector<T> &v)
{
    std::stringstream ss;
    typename std::vector<T>::const_iterator it =  v.begin();
    typename std::vector<T>::const_iterator last =  v.end();
    ss << "< ";
    while(it != last)
    {
        if(it != v.begin())
            ss << ", ";

        ss << SoftPrintVector(*it);        
        it++;
    }
    ss << " >";
    return(ss.str());
}